

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

int Gia_ManQuantCheckOverlap(Gia_Man_t *p,int iObj)

{
  int iVar1;
  word *pIn1;
  word *pIn2;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pIn1 = Gia_ManQuantInfoId(p,iObj);
  pIn2 = Gia_ManQuantInfoId(p,0);
  iVar1 = Abc_TtIntersect(pIn1,pIn2,p->nSuppWords,0);
  return iVar1;
}

Assistant:

int Gia_ManQuantCheckOverlap( Gia_Man_t * p, int iObj )
{
    return Abc_TtIntersect( Gia_ManQuantInfoId(p, iObj), Gia_ManQuantInfoId(p, 0), p->nSuppWords, 0 );
}